

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O2

bool __thiscall
DIS::StandardVariableSpecification::operator==
          (StandardVariableSpecification *this,StandardVariableSpecification *rhs)

{
  pointer pSVar1;
  bool bVar2;
  bool bVar3;
  size_t idx;
  ulong uVar4;
  long lVar5;
  
  bVar3 = true;
  lVar5 = 0;
  for (uVar4 = 0;
      pSVar1 = (this->_standardVariables).
               super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->_standardVariables).
                             super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60);
      uVar4 = uVar4 + 1) {
    bVar2 = SimulationManagementPduHeader::operator==
                      ((SimulationManagementPduHeader *)
                       ((long)&pSVar1->_vptr_SimulationManagementPduHeader + lVar5),
                       (SimulationManagementPduHeader *)
                       ((long)&((rhs->_standardVariables).
                                super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_SimulationManagementPduHeader + lVar5));
    bVar3 = (bool)(bVar3 & bVar2);
    lVar5 = lVar5 + 0x60;
  }
  return bVar3;
}

Assistant:

bool StandardVariableSpecification::operator ==(const StandardVariableSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        if( ! ( _standardVariables[idx] == rhs._standardVariables[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }